

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Optimizer::Optimizer(Optimizer *this,Optimizer *from)

{
  void *pvVar1;
  AdamOptimizer *this_00;
  SGDOptimizer *this_01;
  AdamOptimizer *from_00;
  SGDOptimizer *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Optimizer_0042f498;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 10) {
    clear_OptimizerType(this);
    this->_oneof_case_[0] = 10;
    this_01 = (SGDOptimizer *)operator_new(0x30);
    SGDOptimizer::SGDOptimizer(this_01);
    (this->OptimizerType_).sgdoptimizer_ = this_01;
    if (from->_oneof_case_[0] == 10) {
      from_01 = (from->OptimizerType_).sgdoptimizer_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (SGDOptimizer *)&_SGDOptimizer_default_instance_;
    }
    SGDOptimizer::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 0xb) {
    clear_OptimizerType(this);
    this->_oneof_case_[0] = 0xb;
    this_00 = (AdamOptimizer *)operator_new(0x40);
    AdamOptimizer::AdamOptimizer(this_00);
    (this->OptimizerType_).adamoptimizer_ = this_00;
    if (from->_oneof_case_[0] == 0xb) {
      from_00 = (from->OptimizerType_).adamoptimizer_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_00 = (AdamOptimizer *)&_AdamOptimizer_default_instance_;
    }
    AdamOptimizer::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

Optimizer::Optimizer(const Optimizer& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_OptimizerType();
  switch (from.OptimizerType_case()) {
    case kSgdOptimizer: {
      mutable_sgdoptimizer()->::CoreML::Specification::SGDOptimizer::MergeFrom(from.sgdoptimizer());
      break;
    }
    case kAdamOptimizer: {
      mutable_adamoptimizer()->::CoreML::Specification::AdamOptimizer::MergeFrom(from.adamoptimizer());
      break;
    }
    case OPTIMIZERTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Optimizer)
}